

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_begin(AMQP_VALUE value,BEGIN_HANDLE *begin_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_80;
  fields properties;
  AMQP_VALUE desired_capabilities_array;
  char *desired_capabilities;
  AMQP_VALUE offered_capabilities_array;
  char *offered_capabilities;
  uint32_t local_50;
  handle handle_max;
  uint32_t outgoing_window;
  uint32_t incoming_window;
  transfer_number next_outgoing_id;
  uint16_t remote_channel;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  BEGIN_INSTANCE *begin_instance;
  BEGIN_HANDLE *ppBStack_18;
  int result;
  BEGIN_HANDLE *begin_handle_local;
  AMQP_VALUE value_local;
  
  ppBStack_18 = begin_handle;
  begin_handle_local = (BEGIN_HANDLE *)value;
  list_value = (AMQP_VALUE)begin_create_internal();
  *ppBStack_18 = (BEGIN_HANDLE)list_value;
  if (*ppBStack_18 == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0x91b;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)begin_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      begin_destroy(*ppBStack_18);
      begin_instance._4_4_ = 0x923;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (_next_outgoing_id = amqpvalue_get_list_item(pAStack_30,0),
           _next_outgoing_id != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_next_outgoing_id);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_ushort
                                (_next_outgoing_id,(uint16_t *)((long)&incoming_window + 2)),
             iVar1 != 0)) {
            amqpvalue_destroy(_next_outgoing_id);
            begin_destroy(*ppBStack_18);
            return 0x946;
          }
          amqpvalue_destroy(_next_outgoing_id);
        }
        if (item_value._4_4_ < 2) {
          begin_instance._4_4_ = 0x974;
        }
        else {
          _next_outgoing_id = amqpvalue_get_list_item(pAStack_30,1);
          if (_next_outgoing_id == (AMQP_VALUE)0x0) {
            begin_destroy(*ppBStack_18);
            begin_instance._4_4_ = 0x956;
          }
          else {
            AVar2 = amqpvalue_get_type(_next_outgoing_id);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(_next_outgoing_id);
              begin_destroy(*ppBStack_18);
              begin_instance._4_4_ = 0x960;
            }
            else {
              iVar1 = amqpvalue_get_uint(_next_outgoing_id,&outgoing_window);
              if (iVar1 == 0) {
                amqpvalue_destroy(_next_outgoing_id);
                if (item_value._4_4_ < 3) {
                  begin_instance._4_4_ = 0x99d;
                }
                else {
                  _next_outgoing_id = amqpvalue_get_list_item(pAStack_30,2);
                  if (_next_outgoing_id == (AMQP_VALUE)0x0) {
                    begin_destroy(*ppBStack_18);
                    begin_instance._4_4_ = 0x97f;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(_next_outgoing_id);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(_next_outgoing_id);
                      begin_destroy(*ppBStack_18);
                      begin_instance._4_4_ = 0x989;
                    }
                    else {
                      iVar1 = amqpvalue_get_uint(_next_outgoing_id,&handle_max);
                      if (iVar1 == 0) {
                        amqpvalue_destroy(_next_outgoing_id);
                        if (item_value._4_4_ < 4) {
                          begin_instance._4_4_ = 0x9c6;
                        }
                        else {
                          _next_outgoing_id = amqpvalue_get_list_item(pAStack_30,3);
                          if (_next_outgoing_id == (AMQP_VALUE)0x0) {
                            begin_destroy(*ppBStack_18);
                            begin_instance._4_4_ = 0x9a8;
                          }
                          else {
                            AVar2 = amqpvalue_get_type(_next_outgoing_id);
                            if (AVar2 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy(_next_outgoing_id);
                              begin_destroy(*ppBStack_18);
                              begin_instance._4_4_ = 0x9b2;
                            }
                            else {
                              iVar1 = amqpvalue_get_uint(_next_outgoing_id,&local_50);
                              if (iVar1 == 0) {
                                amqpvalue_destroy(_next_outgoing_id);
                                if ((4 < item_value._4_4_) &&
                                   (_next_outgoing_id = amqpvalue_get_list_item(pAStack_30,4),
                                   _next_outgoing_id != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint(_next_outgoing_id,
                                                                 (uint32_t *)
                                                                 ((long)&offered_capabilities + 4)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_next_outgoing_id);
                                    begin_destroy(*ppBStack_18);
                                    return 0x9de;
                                  }
                                  amqpvalue_destroy(_next_outgoing_id);
                                }
                                if ((5 < item_value._4_4_) &&
                                   (_next_outgoing_id = amqpvalue_get_list_item(pAStack_30,5),
                                   _next_outgoing_id != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                  if (AVar2 != AMQP_TYPE_NULL) {
                                    offered_capabilities_array = (AMQP_VALUE)0x0;
                                    AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                        (iVar1 = amqpvalue_get_array(_next_outgoing_id,
                                                                     (AMQP_VALUE *)
                                                                     &desired_capabilities),
                                        iVar1 != 0)) &&
                                       (iVar1 = amqpvalue_get_symbol
                                                          (_next_outgoing_id,
                                                           (char **)&offered_capabilities_array),
                                       iVar1 != 0)) {
                                      amqpvalue_destroy(_next_outgoing_id);
                                      begin_destroy(*ppBStack_18);
                                      return 0x9fd;
                                    }
                                  }
                                  amqpvalue_destroy(_next_outgoing_id);
                                }
                                if ((6 < item_value._4_4_) &&
                                   (_next_outgoing_id = amqpvalue_get_list_item(pAStack_30,6),
                                   _next_outgoing_id != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                  if (AVar2 != AMQP_TYPE_NULL) {
                                    desired_capabilities_array = (AMQP_VALUE)0x0;
                                    AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                        (iVar1 = amqpvalue_get_array(_next_outgoing_id,&properties),
                                        iVar1 != 0)) &&
                                       (iVar1 = amqpvalue_get_symbol
                                                          (_next_outgoing_id,
                                                           (char **)&desired_capabilities_array),
                                       iVar1 != 0)) {
                                      amqpvalue_destroy(_next_outgoing_id);
                                      begin_destroy(*ppBStack_18);
                                      return 0xa1c;
                                    }
                                  }
                                  amqpvalue_destroy(_next_outgoing_id);
                                }
                                if ((7 < item_value._4_4_) &&
                                   (_next_outgoing_id = amqpvalue_get_list_item(pAStack_30,7),
                                   _next_outgoing_id != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_next_outgoing_id);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_map(_next_outgoing_id,&local_80),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_next_outgoing_id);
                                    begin_destroy(*ppBStack_18);
                                    return 0xa39;
                                  }
                                  amqpvalue_destroy(_next_outgoing_id);
                                }
                                pAVar3 = amqpvalue_clone((AMQP_VALUE)begin_handle_local);
                                *(AMQP_VALUE *)list_value = pAVar3;
                                begin_instance._4_4_ = 0;
                              }
                              else {
                                amqpvalue_destroy(_next_outgoing_id);
                                begin_destroy(*ppBStack_18);
                                begin_instance._4_4_ = 0x9bc;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy(_next_outgoing_id);
                        begin_destroy(*ppBStack_18);
                        begin_instance._4_4_ = 0x993;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(_next_outgoing_id);
                begin_destroy(*ppBStack_18);
                begin_instance._4_4_ = 0x96a;
              }
            }
          }
        }
      }
      else {
        begin_instance._4_4_ = 0x92a;
      }
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int amqpvalue_get_begin(AMQP_VALUE value, BEGIN_HANDLE* begin_handle)
{
    int result;
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin_create_internal();
    *begin_handle = begin_instance;
    if (*begin_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            begin_destroy(*begin_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* remote-channel */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t remote_channel;
                                if (amqpvalue_get_ushort(item_value, &remote_channel) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* next-outgoing-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                transfer_number next_outgoing_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_outgoing_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* incoming-window */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t incoming_window;
                                if (amqpvalue_get_uint(item_value, &incoming_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* outgoing-window */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t outgoing_window;
                                if (amqpvalue_get_uint(item_value, &outgoing_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle-max */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                handle handle_max;
                                if (amqpvalue_get_handle(item_value, &handle_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    begin_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}